

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O0

tuple<bool,_const_char_*,_const_char_*> * QueryHPCEnvironment(void)

{
  char *pcVar1;
  tuple<bool,_const_char_*,_const_char_*> *in_RDI;
  char *procid;
  char *envval;
  anon_class_1_0_00000001 mk;
  
  pcVar1 = getenv("PMIX_RANK");
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    pcVar1 = getenv("SLURM_JOB_ID");
    if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
      pcVar1 = getenv("OMPI_HOME");
      if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
        pcVar1 = getenv("PMI_RANK");
        if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
          QueryHPCEnvironment::anon_class_1_0_00000001::operator()
                    (in_RDI,(anon_class_1_0_00000001 *)((long)&envval + 7),false,"","");
        }
        else {
          QueryHPCEnvironment::anon_class_1_0_00000001::operator()
                    (in_RDI,(anon_class_1_0_00000001 *)((long)&envval + 7),false,".rank-",pcVar1);
        }
      }
      else {
        QueryHPCEnvironment::anon_class_1_0_00000001::operator()
                  (in_RDI,(anon_class_1_0_00000001 *)((long)&envval + 7),true,"","");
      }
    }
    else {
      pcVar1 = getenv("SLURM_PROCID");
      if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
        QueryHPCEnvironment::anon_class_1_0_00000001::operator()
                  (in_RDI,(anon_class_1_0_00000001 *)((long)&envval + 7),true,"","");
      }
      else {
        QueryHPCEnvironment::anon_class_1_0_00000001::operator()
                  (in_RDI,(anon_class_1_0_00000001 *)((long)&envval + 7),false,".slurmid-",pcVar1);
      }
    }
  }
  else {
    QueryHPCEnvironment::anon_class_1_0_00000001::operator()
              (in_RDI,(anon_class_1_0_00000001 *)((long)&envval + 7),false,".rank-",pcVar1);
  }
  return in_RDI;
}

Assistant:

static std::tuple<bool, const char*, const char*> QueryHPCEnvironment() {
  auto mk = [] (bool a, const char* b, const char* c) {
    // We have to work around gcc 5 bug in tuple constructor. It
    // doesn't let us do {a, b, c}
    //
    // TODO(2023-09-27): officially drop gcc 5 support
    return std::make_tuple<bool, const char*, const char*>(std::move(a), std::move(b), std::move(c));
  };

  // Check for the PMIx environment
  const char* envval = getenv("PMIX_RANK");
  if (envval != nullptr && *envval != 0) {
    // PMIx exposes the rank that is convenient for process identification
    // Don't append pid, since we have rank to differentiate.
    return mk(false, ".rank-", envval);
  }

  // Check for the Slurm environment
  envval = getenv("SLURM_JOB_ID");
  if (envval != nullptr && *envval != 0) {
    // Slurm environment detected
    const char* procid = getenv("SLURM_PROCID");
    if (procid != nullptr && *procid != 0) {
      // Use Slurm process ID to differentiate
      return mk(false, ".slurmid-", procid);
    }
    // Need to add PID to avoid conflicts
    return mk(true, "", "");
  }

  // Check for Open MPI environment
  envval = getenv("OMPI_HOME");
  if (envval != nullptr && *envval != 0) {
    return mk(true, "", "");
  }

  // Check for Hydra process manager (MPICH)
  envval = getenv("PMI_RANK");
  if (envval != nullptr && *envval != 0) {
    return mk(false, ".rank-", envval);
  }

  // No HPC environment was detected
  return mk(false, "", "");
}